

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::createUserOpNoOut
          (PcodeCompile *this,UserOpSymbol *sym,
          vector<ExprTree_*,_std::allocator<ExprTree_*>_> *param)

{
  uint4 uVar1;
  OpTpl *this_00;
  VarnodeTpl *this_01;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar2;
  ConstTpl local_a0;
  ConstTpl local_80;
  ConstTpl local_60;
  VarnodeTpl *local_40;
  VarnodeTpl *vn;
  OpTpl *local_28;
  OpTpl *op;
  vector<ExprTree_*,_std::allocator<ExprTree_*>_> *param_local;
  UserOpSymbol *sym_local;
  PcodeCompile *this_local;
  
  op = (OpTpl *)param;
  param_local = (vector<ExprTree_*,_std::allocator<ExprTree_*>_> *)sym;
  sym_local = (UserOpSymbol *)this;
  this_00 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(this_00,CPUI_CALLOTHER);
  local_28 = this_00;
  this_01 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_60,this->constantspace);
  uVar1 = UserOpSymbol::getIndex((UserOpSymbol *)param_local);
  ConstTpl::ConstTpl(&local_80,real,(ulong)uVar1);
  ConstTpl::ConstTpl(&local_a0,real,4);
  VarnodeTpl::VarnodeTpl(this_01,&local_60,&local_80,&local_a0);
  local_40 = this_01;
  OpTpl::addInput(local_28,this_01);
  pvVar2 = ExprTree::appendParams(local_28,(vector<ExprTree_*,_std::allocator<ExprTree_*>_> *)op);
  return pvVar2;
}

Assistant:

vector<OpTpl *> *PcodeCompile::createUserOpNoOut(UserOpSymbol *sym,vector<ExprTree *> *param)

{
  OpTpl *op = new OpTpl(CPUI_CALLOTHER);
  VarnodeTpl *vn = new VarnodeTpl(ConstTpl(constantspace),
				    ConstTpl(ConstTpl::real,sym->getIndex()),
				    ConstTpl(ConstTpl::real,4));
  op->addInput(vn);
  return ExprTree::appendParams(op,param);
}